

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::JsRTCallFunctionAction_Parse
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint uVar1;
  int32 iVar2;
  uint32 uVar3;
  TTDVar pvVar4;
  void **ppvVar5;
  int64 iVar6;
  byte *pbVar7;
  ulong uVar8;
  
  if (evt->EventKind == CallExistingFunctionActionTag) {
    (*reader->_vptr_FileReader[3])(reader,0x12,1);
    pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
    *(TTDVar *)(evt + 1) = pvVar4;
    iVar2 = FileReader::ReadInt32(reader,rootNestingDepth,true);
    *(int32 *)&evt[1].EventTimeStamp = iVar2;
    uVar3 = FileReader::ReadLengthValue(reader,true);
    *(uint32 *)((long)&evt[1].EventTimeStamp + 4) = uVar3;
    ppvVar5 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)uVar3);
    *(void ***)(evt + 2) = ppvVar5;
    FileReader::ReadSequenceStart_WDefaultKey(reader,true);
    if (*(int *)((long)&evt[1].EventTimeStamp + 4) != 0) {
      uVar8 = 0;
      do {
        pvVar4 = NSSnapValues::ParseTTDVar(uVar8 != 0,reader);
        *(TTDVar *)(*(long *)(evt + 2) + uVar8 * 8) = pvVar4;
        uVar8 = uVar8 + 1;
      } while (uVar8 < *(uint *)((long)&evt[1].EventTimeStamp + 4));
    }
    (*reader->_vptr_FileReader[5])(reader);
    iVar6 = FileReader::ReadInt64(reader,eventTime,true);
    evt[2].EventTimeStamp = iVar6;
    iVar6 = FileReader::ReadInt64(reader,eventTime,true);
    evt[3].EventKind = (int)iVar6;
    evt[3].ResultStatus = (int)((ulong)iVar6 >> 0x20);
    pbVar7 = SlabAllocatorBase<8>::SlabAllocateTypeRawSize<80ul>(alloc);
    evt[3].EventTimeStamp = (int64)pbVar7;
    pbVar7[0] = '\0';
    pbVar7[1] = '\0';
    pbVar7[2] = '\0';
    pbVar7[3] = '\0';
    pbVar7[4] = '\0';
    pbVar7[5] = '\0';
    pbVar7[6] = '\0';
    pbVar7[7] = '\0';
    uVar1 = *(uint *)((long)&evt[1].EventTimeStamp + 4);
    if (uVar1 < 2) {
      ppvVar5 = (void **)0x0;
    }
    else {
      ppvVar5 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(uVar1 - 1));
      pbVar7 = (byte *)evt[3].EventTimeStamp;
    }
    *(void ***)(pbVar7 + 8) = ppvVar5;
    TTDebuggerSourceLocation::Initialize((TTDebuggerSourceLocation *)(pbVar7 + 0x10));
    iVar6 = FileReader::ReadInt64(reader,i64Val,true);
    evt[4].EventKind = (int)iVar6;
    evt[4].ResultStatus = (int)((ulong)iVar6 >> 0x20);
    (*reader->_vptr_FileReader[3])(reader,0x37,1);
    (*reader->_vptr_FileReader[0x14])(reader,alloc,&evt[4].EventTimeStamp,0);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCallFunctionAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            cfAction->Result = NSSnapValues::ParseTTDVar(false, reader);

            cfAction->CallbackDepth = reader->ReadInt32(NSTokens::Key::rootNestingDepth, true);

            cfAction->ArgCount = reader->ReadLengthValue(true);
            cfAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(cfAction->ArgCount);

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < cfAction->ArgCount; ++i)
            {
                cfAction->ArgArray[i] = NSSnapValues::ParseTTDVar(i != 0, reader);
            }
            reader->ReadSequenceEnd();

            cfAction->CallEventTime = reader->ReadInt64(NSTokens::Key::eventTime, true);

            cfAction->TopLevelCallbackEventTime = reader->ReadInt64(NSTokens::Key::eventTime, true);

            cfAction->AdditionalReplayInfo = alloc.SlabAllocateStruct<JsRTCallFunctionAction_ReplayAdditionalInfo>();

            cfAction->AdditionalReplayInfo->RtRSnap = nullptr;
            cfAction->AdditionalReplayInfo->ExecArgs = (cfAction->ArgCount > 1) ? alloc.SlabAllocateArray<Js::Var>(cfAction->ArgCount - 1) : nullptr; //ArgCount includes slot for function which we don't use in exec

            cfAction->AdditionalReplayInfo->LastExecutedLocation.Initialize();

#if ENABLE_TTD_INTERNAL_DIAGNOSTICS
            cfAction->LastNestedEvent = reader->ReadInt64(NSTokens::Key::i64Val, true);
            reader->ReadString(NSTokens::Key::name, alloc, cfAction->FunctionName, true);
#endif
        }